

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# printer_yin.c
# Opt level: O0

void yin_print_must(lyout *out,int level,lys_module *module,lys_restr *must)

{
  int local_34;
  char *pcStack_30;
  int content;
  char *str;
  lys_restr *must_local;
  lys_module *module_local;
  lyout *plStack_10;
  int level_local;
  lyout *out_local;
  
  local_34 = 0;
  str = (char *)must;
  must_local = (lys_restr *)module;
  module_local._4_4_ = level;
  plStack_10 = out;
  pcStack_30 = transform_json2schema(module,must->expr);
  if (pcStack_30 == (char *)0x0) {
    ly_print(plStack_10,"(!error!)");
  }
  else {
    ly_print(plStack_10,"%*s<must condition=\"",(ulong)(uint)(module_local._4_4_ << 1),"");
    lyxml_dump_text(plStack_10,pcStack_30,LYXML_DATA_ATTR);
    ly_print(plStack_10,"\"");
    lydict_remove((ly_ctx *)must_local->expr,pcStack_30);
    yin_print_restr(plStack_10,module_local._4_4_ + 1,(lys_module *)must_local,(lys_restr *)str,
                    &local_34);
    yin_print_close(plStack_10,module_local._4_4_,(char *)0x0,"must",local_34);
  }
  return;
}

Assistant:

static void
yin_print_must(struct lyout *out, int level, const struct lys_module *module, const struct lys_restr *must)
{
    const char *str;
    int content = 0;

    str = transform_json2schema(module, must->expr);
    if (!str) {
        ly_print(out, "(!error!)");
        return;
    }

    ly_print(out, "%*s<must condition=\"", LEVEL, INDENT);
    lyxml_dump_text(out, str, LYXML_DATA_ATTR);
    ly_print(out, "\"");
    lydict_remove(module->ctx, str);

    yin_print_restr(out, level + 1, module, must, &content);
    yin_print_close(out, level, NULL, "must", content);
}